

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_finished(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_iovec_t message)

{
  st_ptls_key_schedule_t *sched;
  ptls_iovec_t ikm;
  int local_6c;
  undefined1 local_68 [4];
  int ret;
  uint8_t send_secret [64];
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  send_secret._56_8_ = sendbuf;
  local_6c = verify_finished(tls,message);
  if (local_6c == 0) {
    key_schedule_update_hash(tls->key_schedule,message.base,message.len);
    sched = tls->key_schedule;
    ikm = ptls_iovec_init((void *)0x0,0);
    local_6c = key_schedule_extract(sched,ikm);
    if (((local_6c == 0) &&
        (local_6c = setup_traffic_protection
                              (tls,tls->cipher_suite,0,"server application traffic secret"),
        local_6c == 0)) &&
       (local_6c = derive_secret(tls->key_schedule,local_68,"client application traffic secret"),
       local_6c == 0)) {
      send_finished(tls,(ptls_buffer_t *)send_secret._56_8_);
      memcpy(&(tls->traffic_protection).enc,local_68,0x40);
      local_6c = setup_traffic_protection(tls,tls->cipher_suite,1,(char *)0x0);
      if (local_6c == 0) {
        tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
      }
    }
  }
  (*ptls_clear_memory)(local_68,0x40);
  return local_6c;
}

Assistant:

static int client_handle_finished(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_iovec_t message)
{
    uint8_t send_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        goto Exit;
    key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    /* update traffic keys by using messages upto ServerFinished, but commission them after sending ClientFinished */
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 0, "server application traffic secret")) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, send_secret, "client application traffic secret")) != 0)
        goto Exit;

    ret = send_finished(tls, sendbuf);

    memcpy(tls->traffic_protection.enc.secret, send_secret, sizeof(send_secret));
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 1, NULL)) != 0)
        goto Exit;

    tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    ptls_clear_memory(send_secret, sizeof(send_secret));
    return ret;
}